

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

void ftxui::anon_unknown_0::UpdatePixelStyle
               (Screen *screen,stringstream *ss,Pixel *prev,Pixel *next)

{
  ostream *poVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  long *plVar5;
  size_t sVar6;
  byte bVar7;
  long *plVar8;
  byte bVar9;
  char *pcVar10;
  char *pcVar11;
  long *plVar12;
  long *local_90;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (next->hyperlink != prev->hyperlink) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  bVar3 = *(byte *)next;
  bVar7 = *(byte *)prev;
  bVar9 = bVar7 ^ bVar3;
  if ((bVar9 & 4) != 0 || (bVar7 & 2) != (bVar3 & 2)) {
    poVar1 = (ostream *)(ss + 0x10);
    if ((bVar3 & 2) == 0 && (bVar7 & 2) != 0) {
      pcVar11 = "\x1b[22m";
    }
    else {
      pcVar11 = "";
      if (((bVar7 & 4) != 0) && (pcVar11 = "", (bVar3 & 4) == 0)) {
        pcVar11 = "\x1b[22m";
      }
    }
    sVar6 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar11,sVar6);
    pcVar11 = "\x1b[1m";
    if ((*(byte *)next & 2) == 0) {
      pcVar11 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,pcVar11,(ulong)((*(byte *)next & 2) * 2));
    pcVar11 = "\x1b[2m";
    if ((*(byte *)next & 4) == 0) {
      pcVar11 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar11,(ulong)*(byte *)next & 4);
    bVar3 = *(byte *)next;
    bVar7 = *(byte *)prev;
    bVar9 = bVar7 ^ bVar3;
  }
  if ((bVar9 & 0x30) != 0) {
    pcVar11 = "\x1b[21m";
    if ((bVar3 & 0x20) == 0) {
      pcVar11 = "\x1b[24m";
    }
    bVar4 = (bVar3 & 0x10) == 0;
    pcVar10 = "\x1b[4m";
    if (bVar4) {
      pcVar10 = pcVar11;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),pcVar10,(ulong)bVar4 | 4);
    bVar3 = *(byte *)next;
    bVar7 = *(byte *)prev;
    bVar9 = bVar7 ^ bVar3;
  }
  if ((bVar9 & 1) != 0) {
    pcVar11 = "\x1b[25m";
    if ((bVar3 & 1) != 0) {
      pcVar11 = "\x1b[5m";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),pcVar11,(ulong)(bVar3 & 1) ^ 5);
    bVar3 = *(byte *)next;
    bVar7 = *(byte *)prev;
  }
  if ((bool)((bVar3 & 8) >> 3) != ((bVar7 >> 3 & 1) != 0)) {
    bVar4 = (bVar3 & 8) == 0;
    pcVar11 = "\x1b[7m";
    if (bVar4) {
      pcVar11 = "\x1b[27m";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),pcVar11,(ulong)bVar4 | 4);
    bVar3 = *(byte *)next;
    bVar7 = *(byte *)prev;
  }
  if ((bool)((bVar3 & 0x40) >> 6) != ((bVar7 >> 6 & 1) != 0)) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  bVar4 = Color::operator!=(&next->foreground_color,&prev->foreground_color);
  if ((bVar4) || (bVar4 = Color::operator!=(&next->background_color,&prev->background_color), bVar4)
     ) {
    Color::Print_abi_cxx11_(&local_50,&next->foreground_color,false);
    std::operator+(&local_70,"\x1b[",&local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar5;
    }
    lVar2 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),(char *)local_90,lVar2);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Color::Print_abi_cxx11_(&local_50,&next->background_color,true);
    std::operator+(&local_70,"\x1b[",&local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      plVar12 = &local_80;
    }
    else {
      local_80 = *plVar8;
      plVar12 = (long *)*plVar5;
    }
    lVar2 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),(char *)plVar12,lVar2)
    ;
    if (plVar12 != &local_80) {
      operator_delete(plVar12,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void UpdatePixelStyle(const Screen* screen,
                      std::stringstream& ss,
                      const Pixel& prev,
                      const Pixel& next) {
  // See https://gist.github.com/egmontkob/eb114294efbcd5adb1944c9f3cb5feda
  if (FTXUI_UNLIKELY(next.hyperlink != prev.hyperlink)) {
    ss << "\x1B]8;;" << screen->Hyperlink(next.hyperlink) << "\x1B\\";
  }

  // Bold
  if (FTXUI_UNLIKELY((next.bold ^ prev.bold) | (next.dim ^ prev.dim))) {
    // BOLD_AND_DIM_RESET:
    ss << ((prev.bold && !next.bold) || (prev.dim && !next.dim) ? "\x1B[22m"
                                                                : "");
    ss << (next.bold ? "\x1B[1m" : "");  // BOLD_SET
    ss << (next.dim ? "\x1B[2m" : "");   // DIM_SET
  }

  // Underline
  if (FTXUI_UNLIKELY(next.underlined != prev.underlined ||
                     next.underlined_double != prev.underlined_double)) {
    ss << (next.underlined          ? "\x1B[4m"     // UNDERLINE
           : next.underlined_double ? "\x1B[21m"    // UNDERLINE_DOUBLE
                                    : "\x1B[24m");  // UNDERLINE_RESET
  }

  // Blink
  if (FTXUI_UNLIKELY(next.blink != prev.blink)) {
    ss << (next.blink ? "\x1B[5m"     // BLINK_SET
                      : "\x1B[25m");  // BLINK_RESET
  }

  // Inverted
  if (FTXUI_UNLIKELY(next.inverted != prev.inverted)) {
    ss << (next.inverted ? "\x1B[7m"     // INVERTED_SET
                         : "\x1B[27m");  // INVERTED_RESET
  }

  // StrikeThrough
  if (FTXUI_UNLIKELY(next.strikethrough != prev.strikethrough)) {
    ss << (next.strikethrough ? "\x1B[9m"     // CROSSED_OUT
                              : "\x1B[29m");  // CROSSED_OUT_RESET
  }

  if (FTXUI_UNLIKELY(next.foreground_color != prev.foreground_color ||
                     next.background_color != prev.background_color)) {
    ss << "\x1B[" + next.foreground_color.Print(false) + "m";
    ss << "\x1B[" + next.background_color.Print(true) + "m";
  }
}